

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::checkEnumerationRequiredNotation
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *type)

{
  XMLBuffer *this_00;
  short sVar1;
  short sVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  XMLStringPool *pXVar5;
  int iVar6;
  uint uVar7;
  short *psVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  short *psVar9;
  XMLCh *pXVar10;
  XMLSize_t count;
  XMLCh *pXVar11;
  
  iVar6 = XMLString::indexOf(type,L':');
  count = 0;
  if (type != (XMLCh *)0x0) {
    do {
      psVar8 = (short *)((long)type + count);
      count = count + 2;
    } while (*psVar8 != 0);
    count = ((long)count >> 1) - 1;
  }
  if (count == (long)(iVar6 + 1)) {
    psVar8 = &XMLUni::fgZeroLenString;
LAB_0032d2cf:
    psVar9 = &XMLUni::fgNotationString;
    while (sVar1 = *psVar8, sVar1 != 0) {
      psVar8 = psVar8 + 1;
      sVar2 = *psVar9;
      psVar9 = psVar9 + 1;
      if (sVar1 != sVar2) {
        return;
      }
    }
  }
  else {
    this_00 = &this->fBuffer;
    if (iVar6 == -1) {
      this_00->fIndex = 0;
      pXVar11 = type;
    }
    else {
      count = count + ~(long)iVar6;
      this_00->fIndex = 0;
      pXVar11 = type + (long)iVar6 + 1;
    }
    XMLBuffer::append(this_00,pXVar11,count);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar7);
    psVar8 = (short *)CONCAT44(extraout_var,iVar6);
    if (psVar8 == &XMLUni::fgNotationString) goto LAB_0032d304;
    if (psVar8 != (short *)0x0) goto LAB_0032d2cf;
    psVar9 = &XMLUni::fgNotationString;
  }
  if (*psVar9 != 0) {
    return;
  }
LAB_0032d304:
  iVar6 = XMLString::indexOf(type,L':');
  if (iVar6 + 1U < 2) {
    pXVar11 = L"";
  }
  else {
    (this->fBuffer).fIndex = 0;
    XMLBuffer::append(&this->fBuffer,type,(long)iVar6);
    pXVar5 = this->fStringPool;
    (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
    uVar7 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
    iVar6 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar7);
    pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar6);
  }
  pXVar11 = resolvePrefixToURI(this,elem,pXVar11);
  if (pXVar11 != L"http://www.w3.org/2001/XMLSchema") {
    pXVar10 = L"http://www.w3.org/2001/XMLSchema";
    if (pXVar11 != (XMLCh *)0x0) {
      while (XVar3 = *pXVar11, XVar3 != L'\0') {
        pXVar11 = pXVar11 + 1;
        XVar4 = *pXVar10;
        pXVar10 = pXVar10 + 1;
        if (XVar3 != XVar4) {
          return;
        }
      }
    }
    if (*pXVar10 != L'\0') {
      return;
    }
  }
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",0x5d,name,(XMLCh *)0x0,
                    (XMLCh *)0x0,(XMLCh *)0x0);
  return;
}

Assistant:

void TraverseSchema::checkEnumerationRequiredNotation(const DOMElement* const elem,
                                                      const XMLCh* const name,
                                                      const XMLCh* const type) {

    const XMLCh* localPart = getLocalPart(type);

    if (XMLString::equals(localPart, XMLUni::fgNotationString)) {
        const XMLCh* prefix = getPrefix(type);
        const XMLCh* typeURI = resolvePrefixToURI(elem, prefix);

        if (XMLString::equals(typeURI, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoNotationType, name);
        }
    }
}